

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing.cpp
# Opt level: O1

void prepare_ide(string *base_path,string *problem_no,int file_no)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint __val;
  long *plVar3;
  FILE *pFVar4;
  runtime_error *prVar5;
  uint uVar6;
  size_type *psVar7;
  long *plVar8;
  ulong uVar9;
  uint uVar10;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string f_no;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  string local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  uint local_7c;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_7c = file_no;
  if (file_no == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Which file-set? ",0x10);
    std::istream::operator>>((istream *)&std::cin,(int *)&local_7c);
  }
  pcVar2 = (base_path->_M_dataplus)._M_p;
  local_e0 = &local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar2,pcVar2 + base_path->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)(problem_no->_M_dataplus)._M_p);
  paVar1 = &local_c0.field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0.field_2._8_8_ = plVar3[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_c0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_68 = *plVar8;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar8;
    local_78 = (long *)*plVar3;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&sub_path_abi_cxx11_,(string *)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  __val = -local_7c;
  if (0 < (int)local_7c) {
    __val = local_7c;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar10 = 4;
    do {
      __len = uVar10;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00105cbd;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00105cbd;
      }
      if (uVar6 < 10000) goto LAB_00105cbd;
      uVar9 = uVar9 / 10000;
      uVar10 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00105cbd:
  uVar10 = local_7c >> 0x1f;
  local_78 = &local_68;
  local_58 = problem_no;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)__len - (char)((int)local_7c >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_78 + (ulong)uVar10),__len,__val);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,sub_path_abi_cxx11_._M_dataplus._M_p,
             sub_path_abi_cxx11_._M_dataplus._M_p + sub_path_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_a0);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78);
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_d0 = *plVar8;
    lStack_c8 = plVar3[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar8;
    local_e0 = (long *)*plVar3;
  }
  local_d8 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0.field_2._8_8_ = plVar3[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_c0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&in_name_abi_cxx11_,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,sub_path_abi_cxx11_._M_dataplus._M_p,
             sub_path_abi_cxx11_._M_dataplus._M_p + sub_path_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_a0);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78);
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_d0 = *plVar8;
    lStack_c8 = plVar3[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar8;
    local_e0 = (long *)*plVar3;
  }
  local_d8 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0.field_2._8_8_ = plVar3[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_c0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&out_name_abi_cxx11_,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,sub_path_abi_cxx11_._M_dataplus._M_p,
             sub_path_abi_cxx11_._M_dataplus._M_p + sub_path_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_a0);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78);
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_d0 = *plVar8;
    lStack_c8 = plVar3[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar8;
    local_e0 = (long *)*plVar3;
  }
  local_d8 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0.field_2._8_8_ = plVar3[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_c0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&expected_name_abi_cxx11_,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  std::operator+(&local_50,"Reading files for problem ",local_58);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_90 = *plVar8;
    lStack_88 = plVar3[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar8;
    local_a0 = (long *)*plVar3;
  }
  local_98 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78);
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_d0 = *plVar8;
    lStack_c8 = plVar3[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar8;
    local_e0 = (long *)*plVar3;
  }
  local_d8 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0.field_2._8_8_ = plVar3[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_c0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  write_colored_text(&local_c0,green);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  old_stdout = dup(1);
  pFVar4 = freopen(in_name_abi_cxx11_._M_dataplus._M_p,"r",_stdin);
  if (pFVar4 != (FILE *)0x0) {
    pFVar4 = freopen(out_name_abi_cxx11_._M_dataplus._M_p,"w",_stdout);
    if (pFVar4 != (FILE *)0x0) {
      start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      return;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c0,"Problems reading from out-file ",&out_name_abi_cxx11_);
    std::runtime_error::runtime_error(prVar5,(string *)&local_c0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c0,"Problems reading from in-file ",&in_name_abi_cxx11_);
  std::runtime_error::runtime_error(prVar5,(string *)&local_c0);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void prepare_ide(const string &base_path, const string &problem_no, int file_no) {
    if (file_no == -1) {
        cout << "Which file-set? ";
        cin >> file_no;
    }


    sub_path = base_path + "/in_out_exp_files/" + problem_no + "/";
    string f_no = to_string(file_no);
    in_name = sub_path + "in" + f_no + ".txt";
    out_name = sub_path + "out" + f_no + ".txt";
    expected_name = sub_path + "exp" + f_no + ".txt";

    write_colored_text("Reading files for problem " + problem_no + ", file-nr " + f_no + "...", green);

    /*
     * Note: I initially declared the parameter to pass like:
     *            prepare_ide(string problem_no, int file_no) {...}
     * That worked fine,but CLion complained:
     *            "Clang-Tidy: The parameter 'message' is copied for each invocation but only used as a const reference;
     *            consider making it a const reference."
     * With auto-refactoring by CLion, it was changed to a const reference:
     *            prepare_ide(const string &problem_no, int file_no) {...}
     */

    /*
     * For input file:
     * NOTE: this method requires a char* (or char-array) as first parameter.
     * For conversion, use ...c_str()
     * See https://stackoverflow.com/questions/7352099/stdstring-to-char
     *
     * For replacing 'cout', just write 'stdout'
     */

    // First save the old file-descriptors:
    // -> In linux, the following streams are associated:
    //    - 0: stdin
    //    - 1: stdout
    //    - 2: stderr
//    old_stdin = dup(0);
    old_stdout = dup(1);
    if (!freopen(in_name.c_str(), "r", stdin)) {
        throw runtime_error("Problems reading from in-file " + in_name);
    }
    if (!freopen(out_name.c_str(), "w", stdout)) {
        throw runtime_error("Problems reading from out-file " + out_name);
    }

    // Start the code timer:
    start = chrono::high_resolution_clock::now();
}